

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_column_name(sqlite3_stmt *pStmt,int N)

{
  char *pcVar1;
  
  pcVar1 = (char *)columnName(pStmt,N,sqlite3_value_text,0);
  return pcVar1;
}

Assistant:

SQLITE_API const char *sqlite3_column_name(sqlite3_stmt *pStmt, int N){
  return columnName(
      pStmt, N, (const void*(*)(Mem*))sqlite3_value_text, COLNAME_NAME);
}